

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void ARM_printInst(MCInst *MI,SStream *O,void *Info)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  _Bool _Var3;
  ARM_AM_AddrOpc AVar4;
  uint uVar5;
  uint uVar6;
  int64_t iVar7;
  MCOperand *pMVar8;
  uint64_t uVar9;
  MCRegisterInfo *in_RDX;
  MCInst *in_RDI;
  MCOperand *opc_2;
  MCInst NewMI;
  uint Reg;
  _Bool isStore;
  MCRegisterClass *MRC;
  uint i_1;
  uint BaseReg;
  _Bool Writeback;
  MCOperand *MO2_2;
  uint8_t access;
  MCOperand *MO2_1;
  MCOperand *MO1_1;
  MCOperand *Dst_1;
  uint opc_1;
  MCOperand *MO3;
  MCOperand *MO2;
  MCOperand *MO1;
  MCOperand *Dst;
  uint opc;
  uint pubOpcode;
  uint i;
  uint tmp;
  uint Opcode;
  MCRegisterInfo *MRI;
  undefined4 in_stack_fffffffffffffb28;
  uint in_stack_fffffffffffffb2c;
  MCInst *in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb38;
  uint in_stack_fffffffffffffb3c;
  undefined4 in_stack_fffffffffffffb40;
  uint in_stack_fffffffffffffb44;
  MCRegisterInfo *in_stack_fffffffffffffb48;
  SStream *in_stack_fffffffffffffb50;
  undefined8 in_stack_fffffffffffffb58;
  uint OpNum;
  MCInst *in_stack_fffffffffffffb60;
  MCRegisterInfo *in_stack_fffffffffffffb80;
  SStream *in_stack_fffffffffffffb88;
  MCInst *in_stack_fffffffffffffb90;
  MCInst local_408;
  uint local_a8;
  byte local_a1;
  MCRegisterClass *local_a0;
  uint local_94;
  uint local_90;
  byte local_89;
  MCOperand *local_88;
  uint8_t local_79;
  MCOperand *local_78;
  MCOperand *local_70;
  MCOperand *local_68;
  ARM_AM_ShiftOpc local_5c;
  MCOperand *local_58;
  MCOperand *local_50;
  MCOperand *local_48;
  MCOperand *local_40;
  ARM_AM_ShiftOpc local_34;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  MCRegisterInfo *local_20;
  MCInst *local_8;
  
  local_20 = in_RDX;
  local_8 = in_RDI;
  local_24 = MCInst_getOpcode(in_RDI);
  uVar6 = (uint)((ulong)in_stack_fffffffffffffb58 >> 0x20);
  if (local_24 == 0x72) goto LAB_0029ab25;
  if (local_24 == 0x7f) {
LAB_0029c431:
    local_a0 = MCRegisterInfo_getRegClass(local_20,1);
    uVar6 = CONCAT13(1,(int3)in_stack_fffffffffffffb40);
    if (local_24 != 0x1b4) {
      uVar6 = CONCAT13(local_24 == 0x199,(int3)in_stack_fffffffffffffb40);
    }
    local_a1 = (byte)(uVar6 >> 0x18);
    pMVar8 = MCInst_getOperand(local_8,(uint)(local_a1 != 0));
    local_a8 = MCOperand_getReg(pMVar8);
    _Var3 = MCRegisterClass_contains(local_a0,local_a8);
    if (_Var3) {
      MCInst_Init(&local_408);
      MCInst_setOpcode(&local_408,local_24);
      if ((local_a1 & 1) != 0) {
        pMVar8 = MCInst_getOperand(local_8,0);
        MCInst_addOperand2(&local_408,pMVar8);
      }
      uVar5 = local_a8;
      MCRegisterInfo_getRegClass(local_20,0x12);
      uVar6 = MCRegisterInfo_getMatchingSuperReg
                        (in_stack_fffffffffffffb48,in_stack_fffffffffffffb44,uVar6,
                         (MCRegisterClass *)CONCAT44(uVar5,in_stack_fffffffffffffb38));
      MCOperand_CreateReg0(&local_408,uVar6);
      local_2c = 2;
      if ((local_a1 & 1) != 0) {
        local_2c = 3;
      }
      while (uVar6 = local_2c, uVar5 = MCInst_getNumOperands(local_8), uVar6 < uVar5) {
        pMVar8 = MCInst_getOperand(local_8,local_2c);
        MCInst_addOperand2(&local_408,pMVar8);
        local_2c = local_2c + 1;
      }
      printInstruction(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80
                      );
      return;
    }
LAB_0029c6c2:
    printInstruction(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  }
  else {
    if (local_24 == 0x98) {
LAB_0029bbe7:
      pMVar8 = MCInst_getOperand(local_8,0);
      uVar5 = MCOperand_getReg(pMVar8);
      if ((uVar5 == 0xc) && (uVar5 = MCInst_getNumOperands(local_8), 5 < uVar5)) {
        SStream_concat0((SStream *)in_stack_fffffffffffffb30,
                        (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
        MCInst_setOpcodePub(local_8,0x1a7);
        printPredicateOperand
                  ((MCInst *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                   in_stack_fffffffffffffb3c,(SStream *)in_stack_fffffffffffffb30);
        if (local_24 == 0x949) {
          SStream_concat0((SStream *)in_stack_fffffffffffffb30,
                          (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
        }
        SStream_concat0((SStream *)in_stack_fffffffffffffb30,
                        (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
        local_8->ac_idx = '\x01';
        if (local_8->csh->detail != CS_OPT_OFF) {
          local_8->flat_insn->detail->regs_read[local_8->flat_insn->detail->regs_read_count] = 0xc;
          pcVar2 = local_8->flat_insn->detail;
          pcVar2->regs_read_count = pcVar2->regs_read_count + '\x01';
          local_8->flat_insn->detail->regs_write[local_8->flat_insn->detail->regs_write_count] = 0xc
          ;
          pcVar2 = local_8->flat_insn->detail;
          pcVar2->regs_write_count = pcVar2->regs_write_count + '\x01';
        }
        printRegisterList(in_stack_fffffffffffffb60,uVar6,in_stack_fffffffffffffb50);
        return;
      }
      goto LAB_0029c6c2;
    }
    if (local_24 == 0xa9) goto LAB_0029c431;
    if (local_24 != 0xc0) {
      if (local_24 == 0xe6) {
        local_68 = MCInst_getOperand(local_8,0);
        local_70 = MCInst_getOperand(local_8,1);
        local_78 = MCInst_getOperand(local_8,2);
        iVar7 = MCOperand_getImm(local_78);
        local_5c = ARM_AM_getSORegShOp((uint)iVar7);
        ARM_AM_getShiftOpcStr(local_5c);
        SStream_concat0((SStream *)in_stack_fffffffffffffb30,
                        (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
        switch(local_5c) {
        case ARM_AM_asr:
          MCInst_setOpcodePub(local_8,0x198);
          break;
        case ARM_AM_lsl:
          MCInst_setOpcodePub(local_8,0x19d);
          break;
        case ARM_AM_lsr:
          MCInst_setOpcodePub(local_8,0x19e);
          break;
        case ARM_AM_ror:
          MCInst_setOpcodePub(local_8,0x1a0);
          break;
        case ARM_AM_rrx:
          MCInst_setOpcodePub(local_8,0x1a1);
        }
        printSBitModifierOperand
                  (in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c,(SStream *)0x29b3d7);
        printPredicateOperand
                  ((MCInst *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                   in_stack_fffffffffffffb3c,(SStream *)in_stack_fffffffffffffb30);
        SStream_concat0((SStream *)in_stack_fffffffffffffb30,
                        (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
        MCOperand_getReg(local_68);
        printRegName((cs_struct *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                     (SStream *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                     (uint)((ulong)in_stack_fffffffffffffb30 >> 0x20));
        if (local_8->csh->detail != CS_OPT_OFF) {
          puVar1 = local_8->flat_insn->detail->groups +
                   (ulong)(local_8->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x41;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          uVar6 = MCOperand_getReg(local_68);
          *(uint *)(local_8->flat_insn->detail->groups +
                   (ulong)(local_8->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x45) = uVar6;
          local_8->flat_insn->detail->groups
          [(ulong)(local_8->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x5e] = '\x02';
          pcVar2 = local_8->flat_insn->detail;
          (pcVar2->field_6).arm.op_count = (pcVar2->field_6).arm.op_count + '\x01';
        }
        SStream_concat0((SStream *)in_stack_fffffffffffffb30,
                        (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
        MCOperand_getReg(local_70);
        printRegName((cs_struct *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                     (SStream *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                     (uint)((ulong)in_stack_fffffffffffffb30 >> 0x20));
        if (local_8->csh->detail != CS_OPT_OFF) {
          puVar1 = local_8->flat_insn->detail->groups +
                   (ulong)(local_8->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x41;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          uVar6 = MCOperand_getReg(local_70);
          *(uint *)(local_8->flat_insn->detail->groups +
                   (ulong)(local_8->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x45) = uVar6;
          local_8->flat_insn->detail->groups
          [(ulong)(local_8->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x5e] = '\x01';
          pcVar2 = local_8->flat_insn->detail;
          (pcVar2->field_6).arm.op_count = (pcVar2->field_6).arm.op_count + '\x01';
        }
        if (local_5c == ARM_AM_rrx) {
          return;
        }
        SStream_concat0((SStream *)in_stack_fffffffffffffb30,
                        (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
        iVar7 = MCOperand_getImm(local_78);
        uVar6 = getSORegOffset((uint)iVar7);
        local_28 = translateShiftImm(uVar6);
        printUInt32Bang((SStream *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c);
        if (local_8->csh->detail == CS_OPT_OFF) {
          return;
        }
        *(ARM_AM_ShiftOpc *)
         (local_8->flat_insn->detail->groups +
         (long)(int)((local_8->flat_insn->detail->field_6).arm.op_count - 1) * 0x30 + 0x39) =
             local_5c;
        *(uint *)(local_8->flat_insn->detail->groups +
                 (long)(int)((local_8->flat_insn->detail->field_6).arm.op_count - 1) * 0x30 + 0x3d)
             = local_28;
        return;
      }
      if (local_24 == 0xe7) {
        local_40 = MCInst_getOperand(local_8,0);
        local_48 = MCInst_getOperand(local_8,1);
        local_50 = MCInst_getOperand(local_8,2);
        local_58 = MCInst_getOperand(local_8,3);
        iVar7 = MCOperand_getImm(local_58);
        local_34 = ARM_AM_getSORegShOp((uint)iVar7);
        ARM_AM_getShiftOpcStr(local_34);
        SStream_concat0((SStream *)in_stack_fffffffffffffb30,
                        (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
        switch(local_34) {
        case ARM_AM_asr:
          MCInst_setOpcodePub(local_8,0x198);
          break;
        case ARM_AM_lsl:
          MCInst_setOpcodePub(local_8,0x19d);
          break;
        case ARM_AM_lsr:
          MCInst_setOpcodePub(local_8,0x19e);
          break;
        case ARM_AM_ror:
          MCInst_setOpcodePub(local_8,0x1a0);
          break;
        case ARM_AM_rrx:
          MCInst_setOpcodePub(local_8,0x1a1);
        }
        printSBitModifierOperand
                  (in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c,(SStream *)0x29ae37);
        printPredicateOperand
                  ((MCInst *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                   in_stack_fffffffffffffb3c,(SStream *)in_stack_fffffffffffffb30);
        SStream_concat0((SStream *)in_stack_fffffffffffffb30,
                        (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
        MCOperand_getReg(local_40);
        printRegName((cs_struct *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                     (SStream *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                     (uint)((ulong)in_stack_fffffffffffffb30 >> 0x20));
        if (local_8->csh->detail != CS_OPT_OFF) {
          puVar1 = local_8->flat_insn->detail->groups +
                   (ulong)(local_8->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x41;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          uVar6 = MCOperand_getReg(local_40);
          *(uint *)(local_8->flat_insn->detail->groups +
                   (ulong)(local_8->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x45) = uVar6;
          local_8->flat_insn->detail->groups
          [(ulong)(local_8->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x5e] = '\x02';
          pcVar2 = local_8->flat_insn->detail;
          (pcVar2->field_6).arm.op_count = (pcVar2->field_6).arm.op_count + '\x01';
        }
        SStream_concat0((SStream *)in_stack_fffffffffffffb30,
                        (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
        MCOperand_getReg(local_48);
        printRegName((cs_struct *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                     (SStream *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                     (uint)((ulong)in_stack_fffffffffffffb30 >> 0x20));
        if (local_8->csh->detail != CS_OPT_OFF) {
          puVar1 = local_8->flat_insn->detail->groups +
                   (ulong)(local_8->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x41;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          uVar6 = MCOperand_getReg(local_48);
          *(uint *)(local_8->flat_insn->detail->groups +
                   (ulong)(local_8->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x45) = uVar6;
          local_8->flat_insn->detail->groups
          [(ulong)(local_8->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x5e] = '\x01';
          pcVar2 = local_8->flat_insn->detail;
          (pcVar2->field_6).arm.op_count = (pcVar2->field_6).arm.op_count + '\x01';
        }
        SStream_concat0((SStream *)in_stack_fffffffffffffb30,
                        (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
        uVar6 = (uint)((ulong)in_stack_fffffffffffffb30 >> 0x20);
        MCOperand_getReg(local_50);
        printRegName((cs_struct *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                     (SStream *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),uVar6)
        ;
        if (local_8->csh->detail == CS_OPT_OFF) {
          return;
        }
        puVar1 = local_8->flat_insn->detail->groups +
                 (ulong)(local_8->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x41;
        puVar1[0] = '\x01';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        uVar6 = MCOperand_getReg(local_50);
        *(uint *)(local_8->flat_insn->detail->groups +
                 (ulong)(local_8->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x45) = uVar6;
        local_8->flat_insn->detail->groups
        [(ulong)(local_8->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x5e] = '\x01';
        pcVar2 = local_8->flat_insn->detail;
        (pcVar2->field_6).arm.op_count = (pcVar2->field_6).arm.op_count + '\x01';
        return;
      }
      if (local_24 == 0x199) goto LAB_0029c431;
      if (local_24 == 0x19f) {
LAB_0029b7d0:
        pMVar8 = MCInst_getOperand(local_8,0);
        uVar5 = MCOperand_getReg(pMVar8);
        if ((uVar5 == 0xc) && (uVar5 = MCInst_getNumOperands(local_8), 5 < uVar5)) {
          SStream_concat0((SStream *)in_stack_fffffffffffffb30,
                          (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
          MCInst_setOpcodePub(local_8,0x1a8);
          printPredicateOperand
                    ((MCInst *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                     in_stack_fffffffffffffb3c,(SStream *)in_stack_fffffffffffffb30);
          if (local_24 == 0xa2e) {
            SStream_concat0((SStream *)in_stack_fffffffffffffb30,
                            (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
          }
          SStream_concat0((SStream *)in_stack_fffffffffffffb30,
                          (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
          if (local_8->csh->detail != CS_OPT_OFF) {
            local_8->flat_insn->detail->regs_read[local_8->flat_insn->detail->regs_read_count] = 0xc
            ;
            pcVar2 = local_8->flat_insn->detail;
            pcVar2->regs_read_count = pcVar2->regs_read_count + '\x01';
            local_8->flat_insn->detail->regs_write[local_8->flat_insn->detail->regs_write_count] =
                 0xc;
            pcVar2 = local_8->flat_insn->detail;
            pcVar2->regs_write_count = pcVar2->regs_write_count + '\x01';
          }
          printRegisterList(in_stack_fffffffffffffb60,uVar6,in_stack_fffffffffffffb50);
          return;
        }
      }
      else {
        if (local_24 == 0x1b4) goto LAB_0029c431;
        if (local_24 == 0x1c1) {
          pMVar8 = MCInst_getOperand(local_8,2);
          uVar6 = MCOperand_getReg(pMVar8);
          if (uVar6 == 0xc) {
            pMVar8 = MCInst_getOperand(local_8,3);
            iVar7 = MCOperand_getImm(pMVar8);
            if (iVar7 == -4) {
              SStream_concat0((SStream *)in_stack_fffffffffffffb30,
                              (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28))
              ;
              MCInst_setOpcodePub(local_8,0x1a8);
              printPredicateOperand
                        ((MCInst *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                         in_stack_fffffffffffffb3c,(SStream *)in_stack_fffffffffffffb30);
              SStream_concat0((SStream *)in_stack_fffffffffffffb30,
                              (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28))
              ;
              pMVar8 = MCInst_getOperand(local_8,1);
              MCOperand_getReg(pMVar8);
              printRegName((cs_struct *)
                           CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                           (SStream *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                           (uint)((ulong)in_stack_fffffffffffffb30 >> 0x20));
              if (local_8->csh->detail != CS_OPT_OFF) {
                puVar1 = local_8->flat_insn->detail->groups +
                         (ulong)(local_8->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x41;
                puVar1[0] = '\x01';
                puVar1[1] = '\0';
                puVar1[2] = '\0';
                puVar1[3] = '\0';
                pMVar8 = MCInst_getOperand(local_8,1);
                uVar6 = MCOperand_getReg(pMVar8);
                *(uint *)(local_8->flat_insn->detail->groups +
                         (ulong)(local_8->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x45) =
                     uVar6;
                MCInst_getOpcode(local_8);
                local_79 = get_op_access((cs_struct *)
                                         CONCAT44(in_stack_fffffffffffffb3c,
                                                  in_stack_fffffffffffffb38),
                                         (uint)((ulong)in_stack_fffffffffffffb30 >> 0x20),
                                         (uint)in_stack_fffffffffffffb30);
                local_8->flat_insn->detail->groups
                [(ulong)(local_8->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x5e] = local_79
                ;
                local_8->ac_idx = local_8->ac_idx + '\x01';
                pcVar2 = local_8->flat_insn->detail;
                (pcVar2->field_6).arm.op_count = (pcVar2->field_6).arm.op_count + '\x01';
              }
              SStream_concat0((SStream *)in_stack_fffffffffffffb30,
                              (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28))
              ;
              return;
            }
          }
        }
        else if ((local_24 == 0x4e7) || (local_24 == 0x4eb)) {
          pMVar8 = MCInst_getOperand(local_8,0);
          uVar5 = MCOperand_getReg(pMVar8);
          if (uVar5 == 0xc) {
            SStream_concat0((SStream *)in_stack_fffffffffffffb30,
                            (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
            MCInst_setOpcodePub(local_8,0x1b0);
            printPredicateOperand
                      ((MCInst *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                       in_stack_fffffffffffffb3c,(SStream *)in_stack_fffffffffffffb30);
            SStream_concat0((SStream *)in_stack_fffffffffffffb30,
                            (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
            printRegisterList(in_stack_fffffffffffffb60,uVar6,in_stack_fffffffffffffb50);
            return;
          }
        }
        else if ((local_24 == 0x883) || (local_24 == 0x887)) {
          pMVar8 = MCInst_getOperand(local_8,0);
          uVar5 = MCOperand_getReg(pMVar8);
          if (uVar5 == 0xc) {
            SStream_concat0((SStream *)in_stack_fffffffffffffb30,
                            (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
            MCInst_setOpcodePub(local_8,0x1af);
            printPredicateOperand
                      ((MCInst *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                       in_stack_fffffffffffffb3c,(SStream *)in_stack_fffffffffffffb30);
            SStream_concat0((SStream *)in_stack_fffffffffffffb30,
                            (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
            printRegisterList(in_stack_fffffffffffffb60,uVar6,in_stack_fffffffffffffb50);
            return;
          }
        }
        else {
          if (local_24 == 0x928) {
LAB_0029ab25:
            pMVar8 = MCInst_getOperand(local_8,0);
            iVar7 = MCOperand_getImm(pMVar8);
            switch(iVar7) {
            case 0:
              SStream_concat0((SStream *)in_stack_fffffffffffffb30,
                              (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28))
              ;
              local_30 = 0x1a9;
              break;
            case 1:
              SStream_concat0((SStream *)in_stack_fffffffffffffb30,
                              (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28))
              ;
              local_30 = 0x1aa;
              break;
            case 2:
              SStream_concat0((SStream *)in_stack_fffffffffffffb30,
                              (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28))
              ;
              local_30 = 0x1ab;
              break;
            case 3:
              SStream_concat0((SStream *)in_stack_fffffffffffffb30,
                              (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28))
              ;
              local_30 = 0x1ac;
              break;
            case 4:
              SStream_concat0((SStream *)in_stack_fffffffffffffb30,
                              (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28))
              ;
              local_30 = 0x1ad;
              break;
            case 5:
              uVar9 = ARM_getFeatureBits(local_8->csh->mode);
              if ((uVar9 & 0x20000000000) == 0) goto switchD_0029ab67_default;
              SStream_concat0((SStream *)in_stack_fffffffffffffb30,
                              (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28))
              ;
              local_30 = 0x1ae;
              break;
            default:
switchD_0029ab67_default:
              printInstruction(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
                               in_stack_fffffffffffffb80);
              return;
            }
            printPredicateOperand
                      ((MCInst *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                       in_stack_fffffffffffffb3c,(SStream *)in_stack_fffffffffffffb30);
            if (local_24 == 0x928) {
              SStream_concat0((SStream *)in_stack_fffffffffffffb30,
                              (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28))
              ;
            }
            MCInst_setOpcodePub(local_8,local_30);
            return;
          }
          if (local_24 == 0x949) goto LAB_0029bbe7;
          if (local_24 == 0xa2e) goto LAB_0029b7d0;
          if (local_24 == 0xa4d) {
            pMVar8 = MCInst_getOperand(local_8,0);
            uVar6 = MCInst_getNumOperands(local_8);
            if ((((uVar6 == 3) && (_Var3 = MCOperand_isImm(pMVar8), _Var3)) &&
                (iVar7 = MCOperand_getImm(pMVar8), iVar7 == 0)) &&
               (uVar9 = ARM_getFeatureBits(local_8->csh->mode), (uVar9 & 0x100000000) != 0)) {
              SStream_concat0((SStream *)in_stack_fffffffffffffb30,
                              (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28))
              ;
              MCInst_setOpcodePub(local_8,0x23);
              printPredicateOperand
                        ((MCInst *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                         in_stack_fffffffffffffb3c,(SStream *)in_stack_fffffffffffffb30);
              return;
            }
          }
          else {
            if (local_24 == 0xaad) goto LAB_0029ab25;
            if (local_24 == 0xab1) {
              local_89 = 1;
              pMVar8 = MCInst_getOperand(local_8,0);
              local_90 = MCOperand_getReg(pMVar8);
              local_94 = 3;
              while( true ) {
                uVar6 = local_94;
                uVar5 = MCInst_getNumOperands(local_8);
                OpNum = (uint)((ulong)in_stack_fffffffffffffb58 >> 0x20);
                if (uVar5 <= uVar6) break;
                pMVar8 = MCInst_getOperand(local_8,local_94);
                uVar6 = MCOperand_getReg(pMVar8);
                if (uVar6 == local_90) {
                  local_89 = 0;
                }
                local_94 = local_94 + 1;
              }
              SStream_concat0((SStream *)in_stack_fffffffffffffb30,
                              (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28))
              ;
              MCInst_setOpcodePub(local_8,0x3b);
              printPredicateOperand
                        ((MCInst *)CONCAT44(uVar6,in_stack_fffffffffffffb40),
                         in_stack_fffffffffffffb3c,(SStream *)in_stack_fffffffffffffb30);
              SStream_concat0((SStream *)in_stack_fffffffffffffb30,
                              (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28))
              ;
              printRegName((cs_struct *)CONCAT44(uVar6,in_stack_fffffffffffffb40),
                           (SStream *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                           (uint)((ulong)in_stack_fffffffffffffb30 >> 0x20));
              if (local_8->csh->detail != CS_OPT_OFF) {
                puVar1 = local_8->flat_insn->detail->groups +
                         (ulong)(local_8->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x41;
                puVar1[0] = '\x01';
                puVar1[1] = '\0';
                puVar1[2] = '\0';
                puVar1[3] = '\0';
                *(uint *)(local_8->flat_insn->detail->groups +
                         (ulong)(local_8->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x45) =
                     local_90;
                local_8->flat_insn->detail->groups
                [(ulong)(local_8->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x5e] = '\x03';
                pcVar2 = local_8->flat_insn->detail;
                (pcVar2->field_6).arm.op_count = (pcVar2->field_6).arm.op_count + '\x01';
              }
              if ((local_89 & 1) != 0) {
                local_8->writeback = true;
                SStream_concat0((SStream *)in_stack_fffffffffffffb30,
                                (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28
                                                ));
              }
              SStream_concat0((SStream *)in_stack_fffffffffffffb30,
                              (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28))
              ;
              printRegisterList(in_stack_fffffffffffffb60,OpNum,in_stack_fffffffffffffb50);
              return;
            }
          }
        }
      }
      goto LAB_0029c6c2;
    }
    pMVar8 = MCInst_getOperand(local_8,2);
    uVar6 = MCOperand_getReg(pMVar8);
    if (uVar6 != 0xc) goto LAB_0029c6c2;
    local_88 = MCInst_getOperand(local_8,4);
    iVar7 = MCOperand_getImm(local_88);
    AVar4 = getAM2Op((uint)iVar7);
    if (AVar4 == ARM_AM_add) {
      iVar7 = MCOperand_getImm(local_88);
      uVar6 = getAM2Offset((uint)iVar7);
      if (uVar6 != 4) goto LAB_0029bdf8;
    }
    else {
LAB_0029bdf8:
      iVar7 = MCOperand_getImm(local_88);
      if (iVar7 != 4) goto LAB_0029c6c2;
    }
    SStream_concat0((SStream *)in_stack_fffffffffffffb30,
                    (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
    MCInst_setOpcodePub(local_8,0x1a7);
    printPredicateOperand
              ((MCInst *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
               in_stack_fffffffffffffb3c,(SStream *)in_stack_fffffffffffffb30);
    SStream_concat0((SStream *)in_stack_fffffffffffffb30,
                    (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
    pMVar8 = MCInst_getOperand(local_8,0);
    MCOperand_getReg(pMVar8);
    printRegName((cs_struct *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                 (SStream *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                 (uint)((ulong)in_stack_fffffffffffffb30 >> 0x20));
    if (local_8->csh->detail != CS_OPT_OFF) {
      puVar1 = local_8->flat_insn->detail->groups +
               (ulong)(local_8->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x41;
      puVar1[0] = '\x01';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      pMVar8 = MCInst_getOperand(local_8,0);
      uVar6 = MCOperand_getReg(pMVar8);
      *(uint *)(local_8->flat_insn->detail->groups +
               (ulong)(local_8->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x45) = uVar6;
      local_8->flat_insn->detail->groups
      [(ulong)(local_8->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x5e] = '\x02';
      pcVar2 = local_8->flat_insn->detail;
      (pcVar2->field_6).arm.op_count = (pcVar2->field_6).arm.op_count + '\x01';
      local_8->flat_insn->detail->regs_read[local_8->flat_insn->detail->regs_read_count] = 0xc;
      pcVar2 = local_8->flat_insn->detail;
      pcVar2->regs_read_count = pcVar2->regs_read_count + '\x01';
      local_8->flat_insn->detail->regs_write[local_8->flat_insn->detail->regs_write_count] = 0xc;
      pcVar2 = local_8->flat_insn->detail;
      pcVar2->regs_write_count = pcVar2->regs_write_count + '\x01';
    }
    SStream_concat0((SStream *)in_stack_fffffffffffffb30,
                    (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
  }
  return;
}

Assistant:

void ARM_printInst(MCInst *MI, SStream *O, void *Info)
{
	MCRegisterInfo *MRI = (MCRegisterInfo *)Info;
	unsigned Opcode = MCInst_getOpcode(MI), tmp, i, pubOpcode;


	// printf(">>> Opcode 0: %u\n", MCInst_getOpcode(MI));
	switch(Opcode) {
		// Check for HINT instructions w/ canonical names.
		case ARM_HINT:
		case ARM_tHINT:
		case ARM_t2HINT:
			switch (MCOperand_getImm(MCInst_getOperand(MI, 0))) {
				case 0: SStream_concat0(O, "nop"); pubOpcode = ARM_INS_NOP; break;
				case 1: SStream_concat0(O, "yield"); pubOpcode = ARM_INS_YIELD; break;
				case 2: SStream_concat0(O, "wfe"); pubOpcode = ARM_INS_WFE; break;
				case 3: SStream_concat0(O, "wfi"); pubOpcode = ARM_INS_WFI; break;
				case 4: SStream_concat0(O, "sev"); pubOpcode = ARM_INS_SEV; break;
				case 5:
						if ((ARM_getFeatureBits(MI->csh->mode) & ARM_HasV8Ops)) {
							SStream_concat0(O, "sevl");
							pubOpcode = ARM_INS_SEVL;
							break;
						}
						// Fallthrough for non-v8
				default:
						// Anything else should just print normally.
						printInstruction(MI, O, MRI);
						return;
			}
			printPredicateOperand(MI, 1, O);
			if (Opcode == ARM_t2HINT)
				SStream_concat0(O, ".w");

			MCInst_setOpcodePub(MI, pubOpcode);

			return;

			// Check for MOVs and print canonical forms, instead.
		case ARM_MOVsr: {
							// FIXME: Thumb variants?
							unsigned int opc;
							MCOperand *Dst = MCInst_getOperand(MI, 0);
							MCOperand *MO1 = MCInst_getOperand(MI, 1);
							MCOperand *MO2 = MCInst_getOperand(MI, 2);
							MCOperand *MO3 = MCInst_getOperand(MI, 3);

							opc = ARM_AM_getSORegShOp((unsigned int)MCOperand_getImm(MO3));
							SStream_concat0(O, ARM_AM_getShiftOpcStr(opc));
							switch(opc) {
								default:
									break;
								case ARM_AM_asr:
									MCInst_setOpcodePub(MI, ARM_INS_ASR);
									break;
								case ARM_AM_lsl:
									MCInst_setOpcodePub(MI, ARM_INS_LSL);
									break;
								case ARM_AM_lsr:
									MCInst_setOpcodePub(MI, ARM_INS_LSR);
									break;
								case ARM_AM_ror:
									MCInst_setOpcodePub(MI, ARM_INS_ROR);
									break;
								case ARM_AM_rrx:
									MCInst_setOpcodePub(MI, ARM_INS_RRX);
									break;
							}
							printSBitModifierOperand(MI, 6, O);
							printPredicateOperand(MI, 4, O);

							SStream_concat0(O, "\t");
							printRegName(MI->csh, O, MCOperand_getReg(Dst));
							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(Dst);
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].access = CS_AC_WRITE;
								MI->flat_insn->detail->arm.op_count++;
							}

							SStream_concat0(O, ", ");
							printRegName(MI->csh, O, MCOperand_getReg(MO1));

							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MO1);
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].access = CS_AC_READ;
								MI->flat_insn->detail->arm.op_count++;
							}

							SStream_concat0(O, ", ");
							printRegName(MI->csh, O, MCOperand_getReg(MO2));
							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MO2);
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].access = CS_AC_READ;
								MI->flat_insn->detail->arm.op_count++;
							}
							//assert(ARM_AM_getSORegOffset(MO3.getImm()) == 0);
							return;
						}

		case ARM_MOVsi: {
							// FIXME: Thumb variants?
							unsigned int opc;
							MCOperand *Dst = MCInst_getOperand(MI, 0);
							MCOperand *MO1 = MCInst_getOperand(MI, 1);
							MCOperand *MO2 = MCInst_getOperand(MI, 2);

							opc = ARM_AM_getSORegShOp((unsigned int)MCOperand_getImm(MO2));
							SStream_concat0(O, ARM_AM_getShiftOpcStr(opc));
							switch(opc) {
								default:
									break;
								case ARM_AM_asr:
									MCInst_setOpcodePub(MI, ARM_INS_ASR);
									break;
								case ARM_AM_lsl:
									MCInst_setOpcodePub(MI, ARM_INS_LSL);
									break;
								case ARM_AM_lsr:
									MCInst_setOpcodePub(MI, ARM_INS_LSR);
									break;
								case ARM_AM_ror:
									MCInst_setOpcodePub(MI, ARM_INS_ROR);
									break;
								case ARM_AM_rrx:
									MCInst_setOpcodePub(MI, ARM_INS_RRX);
									break;
							}
							printSBitModifierOperand(MI, 5, O);
							printPredicateOperand(MI, 3, O);

							SStream_concat0(O, "\t");
							printRegName(MI->csh, O, MCOperand_getReg(Dst));
							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(Dst);
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].access = CS_AC_WRITE;
								MI->flat_insn->detail->arm.op_count++;
							}

							SStream_concat0(O, ", ");
							printRegName(MI->csh, O, MCOperand_getReg(MO1));
							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MO1);
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].access = CS_AC_READ;
								MI->flat_insn->detail->arm.op_count++;
							}

							if (opc == ARM_AM_rrx) {
								//printAnnotation(O, Annot);
								return;
							}

							SStream_concat0(O, ", ");
							tmp = translateShiftImm(getSORegOffset((unsigned int)MCOperand_getImm(MO2)));
							printUInt32Bang(O, tmp);
							if (MI->csh->detail) {
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].shift.type =
									(arm_shifter)opc;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].shift.value = tmp;
							}
							return;
						}

						// A8.6.123 PUSH
		case ARM_STMDB_UPD:
		case ARM_t2STMDB_UPD:
						if (MCOperand_getReg(MCInst_getOperand(MI, 0)) == ARM_SP &&
								MCInst_getNumOperands(MI) > 5) {
							// Should only print PUSH if there are at least two registers in the list.
							SStream_concat0(O, "push");
							MCInst_setOpcodePub(MI, ARM_INS_PUSH);
							printPredicateOperand(MI, 2, O);
							if (Opcode == ARM_t2STMDB_UPD)
								SStream_concat0(O, ".w");
							SStream_concat0(O, "\t");

							if (MI->csh->detail) {
								MI->flat_insn->detail->regs_read[MI->flat_insn->detail->regs_read_count] = ARM_REG_SP;
								MI->flat_insn->detail->regs_read_count++;
								MI->flat_insn->detail->regs_write[MI->flat_insn->detail->regs_write_count] = ARM_REG_SP;
								MI->flat_insn->detail->regs_write_count++;
							}

							printRegisterList(MI, 4, O);
							return;
						}
						break;

		case ARM_STR_PRE_IMM:
						if (MCOperand_getReg(MCInst_getOperand(MI, 2)) == ARM_SP &&
								MCOperand_getImm(MCInst_getOperand(MI, 3)) == -4) {
							SStream_concat0(O, "push");
							MCInst_setOpcodePub(MI, ARM_INS_PUSH);
							printPredicateOperand(MI, 4, O);
							SStream_concat0(O, "\t{");
							printRegName(MI->csh, O, MCOperand_getReg(MCInst_getOperand(MI, 1)));
							if (MI->csh->detail) {
#ifndef CAPSTONE_DIET
								uint8_t access;
#endif
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MCInst_getOperand(MI, 1));
#ifndef CAPSTONE_DIET
								access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
								MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].access = access;
								MI->ac_idx++;
#endif
								MI->flat_insn->detail->arm.op_count++;
							}
							SStream_concat0(O, "}");
							return;
						}
						break;

						// A8.6.122 POP
		case ARM_LDMIA_UPD:
		case ARM_t2LDMIA_UPD:
						if (MCOperand_getReg(MCInst_getOperand(MI, 0)) == ARM_SP &&
								MCInst_getNumOperands(MI) > 5) {
							// Should only print POP if there are at least two registers in the list.
							SStream_concat0(O, "pop");
							MCInst_setOpcodePub(MI, ARM_INS_POP);
							printPredicateOperand(MI, 2, O);
							if (Opcode == ARM_t2LDMIA_UPD)
								SStream_concat0(O, ".w");
							SStream_concat0(O, "\t");
							// unlike LDM, POP only write to registers, so skip the 1st access code
							MI->ac_idx = 1;
							if (MI->csh->detail) {
								MI->flat_insn->detail->regs_read[MI->flat_insn->detail->regs_read_count] = ARM_REG_SP;
								MI->flat_insn->detail->regs_read_count++;
								MI->flat_insn->detail->regs_write[MI->flat_insn->detail->regs_write_count] = ARM_REG_SP;
								MI->flat_insn->detail->regs_write_count++;
							}

							printRegisterList(MI, 4, O);
							return;
						}
						break;

		case ARM_LDR_POST_IMM:
						if (MCOperand_getReg(MCInst_getOperand(MI, 2)) == ARM_SP) {
							MCOperand *MO2 = MCInst_getOperand(MI, 4);
							if ((getAM2Op((unsigned int)MCOperand_getImm(MO2)) == ARM_AM_add &&
										getAM2Offset((unsigned int)MCOperand_getImm(MO2)) == 4) ||
									MCOperand_getImm(MO2) == 4) {
								SStream_concat0(O, "pop");
								MCInst_setOpcodePub(MI, ARM_INS_POP);
								printPredicateOperand(MI, 5, O);
								SStream_concat0(O, "\t{");
								printRegName(MI->csh, O, MCOperand_getReg(MCInst_getOperand(MI, 0)));
								if (MI->csh->detail) {
									MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
									MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MCInst_getOperand(MI, 0));
									MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].access = CS_AC_WRITE;
									MI->flat_insn->detail->arm.op_count++;
                                    // this instruction implicitly read/write SP register
                                    MI->flat_insn->detail->regs_read[MI->flat_insn->detail->regs_read_count] = ARM_REG_SP;
                                    MI->flat_insn->detail->regs_read_count++;
                                    MI->flat_insn->detail->regs_write[MI->flat_insn->detail->regs_write_count] = ARM_REG_SP;
                                    MI->flat_insn->detail->regs_write_count++;
								}
								SStream_concat0(O, "}");
								return;
							}
						}
						break;

						// A8.6.355 VPUSH
		case ARM_VSTMSDB_UPD:
		case ARM_VSTMDDB_UPD:
						if (MCOperand_getReg(MCInst_getOperand(MI, 0)) == ARM_SP) {
							SStream_concat0(O, "vpush");
							MCInst_setOpcodePub(MI, ARM_INS_VPUSH);
							printPredicateOperand(MI, 2, O);
							SStream_concat0(O, "\t");
							printRegisterList(MI, 4, O);
							return;
						}
						break;

						// A8.6.354 VPOP
		case ARM_VLDMSIA_UPD:
		case ARM_VLDMDIA_UPD:
						if (MCOperand_getReg(MCInst_getOperand(MI, 0)) == ARM_SP) {
							SStream_concat0(O, "vpop");
							MCInst_setOpcodePub(MI, ARM_INS_VPOP);
							printPredicateOperand(MI, 2, O);
							SStream_concat0(O, "\t");
							printRegisterList(MI, 4, O);
							return;
						}
						break;

		case ARM_tLDMIA: {
							 bool Writeback = true;
							 unsigned BaseReg = MCOperand_getReg(MCInst_getOperand(MI, 0));
							 unsigned i;
							 for (i = 3; i < MCInst_getNumOperands(MI); ++i) {
								 if (MCOperand_getReg(MCInst_getOperand(MI, i)) == BaseReg)
									 Writeback = false;
							 }

							 SStream_concat0(O, "ldm");
							 MCInst_setOpcodePub(MI, ARM_INS_LDM);

							 printPredicateOperand(MI, 1, O);
							 SStream_concat0(O, "\t");
							 printRegName(MI->csh, O, BaseReg);
							 if (MI->csh->detail) {
								 MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
								 MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = BaseReg;
								 MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].access = CS_AC_READ | CS_AC_WRITE;
								 MI->flat_insn->detail->arm.op_count++;
							 }
							 if (Writeback) {
								 MI->writeback = true;
								 SStream_concat0(O, "!");
							 }
							 SStream_concat0(O, ", ");
							 printRegisterList(MI, 3, O);
							 return;
						 }

						 // Combine 2 GPRs from disassember into a GPRPair to match with instr def.
						 // ldrexd/strexd require even/odd GPR pair. To enforce this constraint,
						 // a single GPRPair reg operand is used in the .td file to replace the two
						 // GPRs. However, when decoding them, the two GRPs cannot be automatically
						 // expressed as a GPRPair, so we have to manually merge them.
						 // FIXME: We would really like to be able to tablegen'erate this.
		case ARM_LDREXD:
		case ARM_STREXD:
		case ARM_LDAEXD:
		case ARM_STLEXD: {
				const MCRegisterClass* MRC = MCRegisterInfo_getRegClass(MRI, ARM_GPRRegClassID);
				bool isStore = Opcode == ARM_STREXD || Opcode == ARM_STLEXD;
				unsigned Reg = MCOperand_getReg(MCInst_getOperand(MI, isStore ? 1 : 0));

				if (MCRegisterClass_contains(MRC, Reg)) {
				    MCInst NewMI;

				    MCInst_Init(&NewMI);
				    MCInst_setOpcode(&NewMI, Opcode);

				    if (isStore)
						MCInst_addOperand2(&NewMI, MCInst_getOperand(MI, 0));

				    MCOperand_CreateReg0(&NewMI, MCRegisterInfo_getMatchingSuperReg(MRI, Reg, ARM_gsub_0,
								MCRegisterInfo_getRegClass(MRI, ARM_GPRPairRegClassID)));

				    // Copy the rest operands into NewMI.
				    for(i = isStore ? 3 : 2; i < MCInst_getNumOperands(MI); ++i)
						MCInst_addOperand2(&NewMI, MCInst_getOperand(MI, i));

				    printInstruction(&NewMI, O, MRI);
				    return;
				}
				break;
		 }
		 // B9.3.3 ERET (Thumb)
		 // For a target that has Virtualization Extensions, ERET is the preferred
		 // disassembly of SUBS PC, LR, #0
		case ARM_t2SUBS_PC_LR: {
						MCOperand *opc = MCInst_getOperand(MI, 0);
						if (MCInst_getNumOperands(MI) == 3 &&
							MCOperand_isImm(opc) &&
							MCOperand_getImm(opc) == 0 &&
							(ARM_getFeatureBits(MI->csh->mode) & ARM_FeatureVirtualization)) {
							SStream_concat0(O, "eret");
							MCInst_setOpcodePub(MI, ARM_INS_ERET);
							printPredicateOperand(MI, 1, O);
							return;
						}
						break;
				}
	}

	//if (printAliasInstr(MI, O, MRI))
	//	printInstruction(MI, O, MRI);
	printInstruction(MI, O, MRI);
}